

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waiter_base.cc
# Opt level: O3

void absl::lts_20250127::synchronization_internal::WaiterBase::MaybeBecomeIdle(void)

{
  ThreadIdentity *pTVar1;
  
  pTVar1 = base_internal::CurrentThreadIdentityIfPresent();
  if (pTVar1 != (ThreadIdentity *)0x0) {
    if ((((pTVar1->is_idle)._M_base._M_i & 1U) == 0) &&
       (0x3c < (pTVar1->ticker).super___atomic_base<int>._M_i -
               (pTVar1->wait_start).super___atomic_base<int>._M_i)) {
      (pTVar1->is_idle)._M_base._M_i = true;
    }
    return;
  }
  __assert_fail("identity != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/internal/waiter_base.cc"
                ,0x1f,"static void absl::synchronization_internal::WaiterBase::MaybeBecomeIdle()");
}

Assistant:

void WaiterBase::MaybeBecomeIdle() {
  base_internal::ThreadIdentity *identity =
      base_internal::CurrentThreadIdentityIfPresent();
  assert(identity != nullptr);
  const bool is_idle = identity->is_idle.load(std::memory_order_relaxed);
  const int ticker = identity->ticker.load(std::memory_order_relaxed);
  const int wait_start = identity->wait_start.load(std::memory_order_relaxed);
  if (!is_idle && ticker - wait_start > kIdlePeriods) {
    identity->is_idle.store(true, std::memory_order_relaxed);
  }
}